

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::convert_row_major_matrix
          (string *__return_storage_ptr__,CompilerGLSL *this,string *exp_str,SPIRType *exp_type,
          uint32_t param_3,bool param_4,bool relaxed)

{
  uint32_t uVar1;
  uint32_t uVar2;
  Polyfill polyfill;
  bool bVar3;
  uint uVar4;
  long lVar5;
  CompilerError *this_00;
  undefined4 in_register_00000084;
  char (*ts_2) [2];
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> column_expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ts_2 = (char (*) [2])CONCAT44(in_register_00000084,param_3);
  strip_enclosed_expression((CompilerGLSL *)__return_storage_ptr__,exp_str);
  bVar3 = Compiler::is_matrix(&this->super_Compiler,exp_type);
  if (bVar3) {
    if ((this->options).version < 0x78) {
      uVar1 = exp_type->vecsize;
      uVar2 = exp_type->columns;
      if (uVar2 == 2 && uVar1 == 2) {
        polyfill = PolyfillTranspose2x2;
      }
      else if (uVar2 == 3 && uVar1 == 3) {
        polyfill = PolyfillTranspose3x3;
      }
      else {
        if ((uVar1 != 4) || (uVar2 != 4)) {
          this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError
                    (this_00,
                     "Non-square matrices are not supported in legacy GLSL, cannot transpose.");
          __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        polyfill = PolyfillTranspose4x4;
      }
      require_polyfill(this,polyfill,relaxed);
      column_expr._M_dataplus._M_p = "MP";
      if (!relaxed) {
        column_expr._M_dataplus._M_p = "";
      }
      if ((this->options).es == false) {
        column_expr._M_dataplus._M_p = "";
      }
      join<char_const(&)[13],char_const*,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                (__return_storage_ptr__,(spirv_cross *)0x278dac,(char (*) [13])&column_expr,
                 (char **)0x29618e,(char (*) [2])exp_str,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x27e75d,
                 (char (*) [2])CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
    }
    else {
      join<char_const(&)[11],std::__cxx11::string&,char_const(&)[2]>
                (__return_storage_ptr__,(spirv_cross *)0x28a266,(char (*) [11])exp_str,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x27e75d,ts_2)
      ;
    }
  }
  else {
    lVar5 = ::std::__cxx11::string::rfind((char)exp_str,0x5b);
    if (lVar5 == -1) {
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)exp_str);
    }
    else {
      ::std::__cxx11::string::substr((ulong)&column_expr,(ulong)exp_str);
      ::std::__cxx11::string::resize((ulong)exp_str);
      lVar5 = ::std::__cxx11::string::rfind((char)&column_expr,0x5d);
      if ((lVar5 != -1) && (lVar5 + 1U != column_expr._M_string_length)) {
        ::std::__cxx11::string::substr((ulong)&local_90,(ulong)&column_expr);
        ::std::__cxx11::string::substr((ulong)&local_50,(ulong)&column_expr);
        ::std::operator+(&local_70,&local_90,&local_50);
        ::std::__cxx11::string::operator=((string *)&column_expr,(string *)&local_70);
        ::std::__cxx11::string::~string((string *)&local_70);
        ::std::__cxx11::string::~string((string *)&local_50);
        ::std::__cxx11::string::~string((string *)&local_90);
      }
      type_to_glsl_constructor_abi_cxx11_(&local_70,this,exp_type);
      ::std::operator+(__return_storage_ptr__,&local_70,"(");
      ::std::__cxx11::string::~string((string *)&local_70);
      uVar4 = 0;
      while (local_90._M_dataplus._M_p._0_4_ = uVar4, uVar4 < exp_type->vecsize) {
        local_50._M_dataplus._M_p._0_1_ = 0x5b;
        join<std::__cxx11::string&,char,unsigned_int&,char,std::__cxx11::string&>
                  (&local_70,(spirv_cross *)exp_str,&local_50,(char *)&local_90,
                   (uint *)&stack0xffffffffffffff4f,(char *)&column_expr,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(0x5d,in_stack_ffffffffffffff48));
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        ::std::__cxx11::string::~string((string *)&local_70);
        uVar4 = (uint)local_90._M_dataplus._M_p + 1;
        if (uVar4 < exp_type->vecsize) {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          uVar4 = (uint)local_90._M_dataplus._M_p + 1;
        }
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&column_expr);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::convert_row_major_matrix(string exp_str, const SPIRType &exp_type, uint32_t /* physical_type_id */,
                                              bool /*is_packed*/, bool relaxed)
{
	strip_enclosed_expression(exp_str);
	if (!is_matrix(exp_type))
	{
		auto column_index = exp_str.find_last_of('[');
		if (column_index == string::npos)
			return exp_str;

		auto column_expr = exp_str.substr(column_index);
		exp_str.resize(column_index);

		auto end_deferred_index = column_expr.find_last_of(']');
		if (end_deferred_index != string::npos && end_deferred_index + 1 != column_expr.size())
		{
			// If we have any data member fixups, it must be transposed so that it refers to this index.
			// E.g. [0].data followed by [1] would be shuffled to [1][0].data which is wrong,
			// and needs to be [1].data[0] instead.
			end_deferred_index++;
			column_expr = column_expr.substr(end_deferred_index) +
			              column_expr.substr(0, end_deferred_index);
		}

		auto transposed_expr = type_to_glsl_constructor(exp_type) + "(";

		// Loading a column from a row-major matrix. Unroll the load.
		for (uint32_t c = 0; c < exp_type.vecsize; c++)
		{
			transposed_expr += join(exp_str, '[', c, ']', column_expr);
			if (c + 1 < exp_type.vecsize)
				transposed_expr += ", ";
		}

		transposed_expr += ")";
		return transposed_expr;
	}
	else if (options.version < 120)
	{
		// GLSL 110, ES 100 do not have transpose(), so emulate it.  Note that
		// these GLSL versions do not support non-square matrices.
		if (exp_type.vecsize == 2 && exp_type.columns == 2)
			require_polyfill(PolyfillTranspose2x2, relaxed);
		else if (exp_type.vecsize == 3 && exp_type.columns == 3)
			require_polyfill(PolyfillTranspose3x3, relaxed);
		else if (exp_type.vecsize == 4 && exp_type.columns == 4)
			require_polyfill(PolyfillTranspose4x4, relaxed);
		else
			SPIRV_CROSS_THROW("Non-square matrices are not supported in legacy GLSL, cannot transpose.");
		return join("spvTranspose", (options.es && relaxed) ? "MP" : "", "(", exp_str, ")");
	}
	else
		return join("transpose(", exp_str, ")");
}